

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall inject::context<0>::context(context<0> *this)

{
  EVP_PKEY_CTX *in_RSI;
  context<0> *this_local;
  
  this->_vptr_context = (_func_int **)&PTR__context_0012a758;
  std::
  map<long,_inject::binding,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::map(&this->_bindings);
  std::
  map<long,_boost::shared_ptr<void>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::map(&this->_singletons);
  init(this,in_RSI);
  return;
}

Assistant:

context() { init(); }